

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection.c
# Opt level: O3

h2o_iovec_t log_priority_actual(h2o_req_t *req)

{
  h2o_conn_t *phVar1;
  undefined1 *puVar2;
  int iVar3;
  ulong uVar4;
  h2o_iovec_t hVar5;
  
  phVar1 = req->conn;
  hVar5.base = (char *)h2o_mem_alloc_pool(&req->pool,0x11);
  puVar2 = (undefined1 *)req[-1].upgrade.len;
  if (&phVar1[2].callbacks == (h2o_conn_callbacks_t **)puVar2) {
    uVar4 = 0;
  }
  else {
    uVar4 = (ulong)*(uint *)(puVar2 + -0xa8);
  }
  iVar3 = sprintf(hVar5.base,"%u:%u",uVar4,(ulong)(ushort)req[-1]._next_filter_index);
  hVar5.len = (size_t)iVar3;
  return hVar5;
}

Assistant:

static h2o_iovec_t log_priority_actual(h2o_req_t *req)
{
    h2o_http2_conn_t *conn = (void *)req->conn;
    h2o_http2_stream_t *stream = H2O_STRUCT_FROM_MEMBER(h2o_http2_stream_t, req, req);
    char *s = h2o_mem_alloc_pool(&stream->req.pool, sizeof(H2O_UINT32_LONGEST_STR ":" H2O_UINT16_LONGEST_STR));
    size_t len = (size_t)sprintf(s, "%" PRIu32 ":%" PRIu16, get_parent_stream_id(conn, stream),
                                 h2o_http2_scheduler_get_weight(&stream->_refs.scheduler));
    return h2o_iovec_init(s, len);
}